

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

decNumber * __thiscall
icu_63::MaybeStackHeaderAndArray<decNumber,_char,_34>::resize
          (MaybeStackHeaderAndArray<decNumber,_char,_34> *this,int32_t newCapacity,int32_t length)

{
  decNumber *__dest;
  size_t __n;
  
  if ((-1 < newCapacity) &&
     (__dest = (decNumber *)uprv_malloc_63((ulong)(newCapacity + 0xc)), __dest != (decNumber *)0x0))
  {
    if (length < 1) {
      __n = 0xc;
    }
    else {
      if (this->capacity < length) {
        length = this->capacity;
      }
      if (newCapacity <= length) {
        length = newCapacity;
      }
      __n = (long)length + 0xc;
    }
    memcpy(__dest,this->ptr,__n);
    releaseMemory(this);
    this->ptr = __dest;
    this->capacity = newCapacity;
    this->needToRelease = '\x01';
    return __dest;
  }
  return (decNumber *)0x0;
}

Assistant:

inline H *MaybeStackHeaderAndArray<H, T, stackCapacity>::resize(int32_t newCapacity,
                                                                int32_t length) {
    if(newCapacity>=0) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStackHeaderAndArray alloc %d + %d * %ul\n", sizeof(H),newCapacity,sizeof(T));
#endif
        H *p=(H *)uprv_malloc(sizeof(H)+newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length<0) {
                length=0;
            } else if(length>0) {
                if(length>capacity) {
                    length=capacity;
                }
                if(length>newCapacity) {
                    length=newCapacity;
                }
            }
            uprv_memcpy(p, ptr, sizeof(H)+(size_t)length*sizeof(T));
            releaseMemory();
            ptr=p;
            capacity=newCapacity;
            needToRelease=TRUE;
        }
        return p;
    } else {
        return NULL;
    }
}